

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

InterfaceHandle __thiscall
helics::CommonCore::registerEndpoint
          (CommonCore *this,LocalFederateId federateID,string_view name,string_view type)

{
  InterfaceHandle handle;
  string_view units;
  undefined1 auVar1 [16];
  FederateState *this_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  size_t size;
  ActionMessage reg;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [10];
  uint16_t local_ce;
  SmallBuffer local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  size = name._M_len;
  this_00 = checkNewInterface(this,federateID,name,ENDPOINT);
  local_e0._0_4_ = 0;
  local_e0._4_4_ = 0;
  local_d8[0] = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_d8;
  local_e8 = local_d8;
  ppVar2 = createBasicHandle(this,(GlobalFederateId)(this_00->global_id)._M_i.gid,
                             (LocalFederateId)(this_00->local_id).fid,ENDPOINT,name,type,
                             (string_view)(auVar1 << 0x40),
                             (this_00->interfaceFlags).super___atomic_base<unsigned_short>._M_i);
  if (local_e8 != local_d8) {
    operator_delete(local_e8,CONCAT71(local_d8._1_7_,local_d8[0]) + 1);
  }
  handle.hid = *(BaseType *)((long)&(ppVar2->first)._M_dataplus._M_p + 4);
  units._M_str = gEmptyString_abi_cxx11_;
  units._M_len = DAT_004ea728;
  FederateState::createInterface
            (this_00,ENDPOINT,handle,name,type,units,
             (this_00->interfaceFlags).super___atomic_base<unsigned_short>._M_i);
  ActionMessage::ActionMessage((ActionMessage *)&local_e8,cmd_reg_end);
  local_e0._4_4_ = handle.hid;
  local_e0._0_4_ = (this_00->global_id)._M_i.gid;
  local_a8.bufferSize = size;
  if ((local_a8.heap != (byte *)name._M_str) && (SmallBuffer::reserve(&local_a8,size), size != 0)) {
    memcpy(local_a8.heap,name._M_str,size);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&local_48,1);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0,
             (local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,type._M_str,type._M_len);
  local_ce = *(uint16_t *)((long)&(ppVar2->first)._M_string_length + 6);
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  push<helics::ActionMessage>(&(this->super_BrokerBase).actionQueue,(ActionMessage *)&local_e8);
  ActionMessage::~ActionMessage((ActionMessage *)&local_e8);
  return (InterfaceHandle)handle.hid;
}

Assistant:

InterfaceHandle CommonCore::registerEndpoint(LocalFederateId federateID,
                                             std::string_view name,
                                             std::string_view type)
{
    auto* fed = checkNewInterface(federateID, name, InterfaceType::ENDPOINT);
    const auto& handle = createBasicHandle(fed->global_id,
                                           fed->local_id,
                                           InterfaceType::ENDPOINT,
                                           name,
                                           type,
                                           std::string{},
                                           fed->getInterfaceFlags());

    auto hid = handle.getInterfaceHandle();
    fed->createInterface(
        InterfaceType::ENDPOINT, hid, name, type, gEmptyString, fed->getInterfaceFlags());
    ActionMessage reg(CMD_REG_ENDPOINT);
    reg.source_id = fed->global_id.load();
    reg.source_handle = hid;
    reg.name(name);
    reg.setStringData(type);
    reg.flags = handle.flags;
    actionQueue.push(std::move(reg));

    return hid;
}